

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall SslUdpSocketImpl::SslUdpSocketImpl(SslUdpSocketImpl *this,BaseSocket *pBkRef)

{
  _Bind<int_(SslUdpSocketImpl::*(SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_48;
  
  UdpSocketImpl::UdpSocketImpl(&this->super_UdpSocketImpl,pBkRef);
  (this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslUdpSocketImpl_00144fc0;
  OpenSSLWrapper::SslUdpContext::SslUdpContext(&this->m_pUdpCtx);
  *(undefined8 *)((long)&(this->m_fSllInitDoneParam).super__Function_base._M_manager + 1) = 0;
  *(undefined8 *)((long)&(this->m_fSllInitDoneParam)._M_invoker + 1) = 0;
  *(undefined8 *)((long)&(this->m_fSllInitDoneParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fSllInitDoneParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fSllInitDone)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fSllInitDoneParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fSllInitDone).super__Function_base._M_functor + 8) = 0;
  (this->m_fSllInitDone).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_pSslCon)._M_t.
  super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ._M_t.
  super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl = (SslConnection *)0x0
  ;
  *(undefined8 *)&(this->m_fSllInitDone).super__Function_base._M_functor = 0;
  (this->m_strDestAddr)._M_dataplus._M_p = (pointer)&(this->m_strDestAddr).field_2;
  (this->m_strDestAddr)._M_string_length = 0;
  (this->m_strDestAddr).field_2._M_local_buf[0] = '\0';
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxEnDecode).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxEnDecode).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_48._M_f = (offset_in_SslUdpSocketImpl_to_subr)DatenEncode;
  local_48._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslUdpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)> *)
             &(this->super_UdpSocketImpl).m_fnSslEncode,&local_48);
  local_48._M_f = (offset_in_SslUdpSocketImpl_to_subr)DatenDecode;
  local_48._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslUdpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslUdpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)> *)
             &(this->super_UdpSocketImpl).m_fnSslDecode,&local_48);
  return;
}

Assistant:

SslUdpSocketImpl::SslUdpSocketImpl(BaseSocket* pBkRef) : UdpSocketImpl(pBkRef), m_bCloseReq(false)
{
    m_fnSslEncode = bind(&SslUdpSocketImpl::DatenEncode, this, _1, _2, _3);
    m_fnSslDecode = bind(&SslUdpSocketImpl::DatenDecode, this, _1, _2, _3);
}